

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateLeaveBlock(jx9_gen_state *pGen,GenBlock **ppBlock)

{
  GenBlock *pBlock_00;
  GenBlock *pBlock;
  GenBlock **ppBlock_local;
  jx9_gen_state *pGen_local;
  
  pBlock_00 = pGen->pCurrent;
  if (pBlock_00 == (GenBlock *)0x0) {
    pGen_local._4_4_ = -3;
  }
  else {
    pGen->pCurrent = pBlock_00->pParent;
    if (ppBlock == (GenBlock **)0x0) {
      GenStateFreeBlock(pBlock_00);
    }
    else {
      *ppBlock = pBlock_00;
    }
    pGen_local._4_4_ = 0;
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 GenStateLeaveBlock(jx9_gen_state *pGen, GenBlock **ppBlock)
{
	GenBlock *pBlock = pGen->pCurrent;
	if( pBlock == 0 ){
		/* No more block to pop */
		return SXERR_EMPTY;
	}
	/* Point to the upper block */
	pGen->pCurrent = pBlock->pParent;
	if( ppBlock ){
		/* Write a pointer to the popped block */
		*ppBlock = pBlock;
	}else{
		/* Safely release the block */
		GenStateFreeBlock(&(*pBlock));	
	}
	return SXRET_OK;
}